

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O3

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapPromiseReactionTaskFunctionInfo
          (SnapObject *snpObject,InflateMap *inflator)

{
  undefined8 *puVar1;
  ScriptContext *ctx;
  JavascriptPromiseReaction *reaction;
  Var argument;
  RecyclableObject *pRVar2;
  
  if (snpObject->SnapObjectTag == SnapPromiseReactionTaskFunctionObject) {
    puVar1 = (undefined8 *)snpObject->AddtlSnapObjectInfo;
    ctx = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
    reaction = NSSnapValues::InflatePromiseReactionInfo
                         ((SnapPromiseReactionInfo *)(puVar1 + 1),ctx,inflator);
    argument = InflateMap::InflateTTDVar(inflator,(TTDVar)*puVar1);
    pRVar2 = Js::JavascriptLibrary::CreatePromiseReactionTaskFunction_TTD
                       ((ctx->super_ScriptContextBase).javascriptLibrary,reaction,argument);
    return pRVar2;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapPromiseReactionTaskFunctionInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            const SnapPromiseReactionTaskFunctionInfo* rInfo = SnapObjectGetAddtlInfoAs<SnapPromiseReactionTaskFunctionInfo*, SnapObjectType::SnapPromiseReactionTaskFunctionObject>(snpObject);
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);

            Js::JavascriptPromiseReaction* reaction = NSSnapValues::InflatePromiseReactionInfo(&rInfo->Reaction, ctx, inflator);
            Js::Var argument = inflator->InflateTTDVar(rInfo->Argument);

            return ctx->GetLibrary()->CreatePromiseReactionTaskFunction_TTD(reaction, argument);
        }